

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

avector<Vec3ff> * __thiscall
embree::XMLLoader::loadVec3ffArray
          (avector<Vec3ff> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  Vec3fx *pVVar6;
  size_t *psVar7;
  runtime_error *this_01;
  ulong uVar8;
  size_t i;
  float fVar9;
  allocator local_c1;
  Vec3fx *local_c0;
  size_t *local_b8;
  avector<Vec3ff> *local_b0;
  string local_a8;
  string local_88;
  float local_68;
  float local_58;
  float local_48;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (Vec3fx *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,"ofs",&local_c1);
    XML::parm(&local_88,this_00,&local_a8);
    bVar3 = std::operator!=(&local_88,"");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    local_b0 = __return_storage_ptr__;
    if (bVar3) {
      loadBinary<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                (__return_storage_ptr__,this,xml);
      __return_storage_ptr__ = local_b0;
    }
    else {
      psVar7 = &__return_storage_ptr__->size_active;
      __return_storage_ptr__->items = (Vec3fx *)0x0;
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      pTVar1 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar4 = (long)pTVar2 - (long)pTVar1;
      uVar5 = lVar4 / 0x48;
      local_b8 = psVar7;
      if ((uVar5 & 3) != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10,pTVar2,lVar4 % 0x48);
        ParseLocation::str_abi_cxx11_(&local_a8,&xml->ptr->loc);
        std::operator+(&local_88,&local_a8,": wrong vector<float4> body");
        std::runtime_error::runtime_error(this_01,(string *)&local_88);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar8 = uVar5 >> 2;
      if (pTVar2 == pTVar1) {
        pVVar6 = (Vec3fx *)0x0;
      }
      else {
        pVVar6 = (Vec3fx *)alignedMalloc(uVar5 << 2,0x10);
        __return_storage_ptr__->items = pVVar6;
        alignedFree((void *)0x0);
        *psVar7 = uVar8;
        psVar7 = &__return_storage_ptr__->size_alloced;
      }
      *psVar7 = uVar8;
      lVar4 = 0;
      local_c0 = pVVar6;
      for (uVar5 = 0; __return_storage_ptr__ = local_b0, uVar5 < uVar8; uVar5 = uVar5 + 1) {
        local_48 = Token::Float((Token *)((long)&((xml->ptr->body).
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->ty +
                                         lVar4),true);
        local_58 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                 super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[1].ty +
                                         lVar4),true);
        local_68 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                 super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[2].ty +
                                         lVar4),true);
        fVar9 = Token::Float((Token *)((long)&(xml->ptr->body).
                                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_start[3].ty +
                                      lVar4),true);
        (pVVar6->field_0).m128[0] = local_48;
        (pVVar6->field_0).m128[1] = local_58;
        (pVVar6->field_0).m128[2] = local_68;
        (pVVar6->field_0).m128[3] = fVar9;
        pVVar6 = pVVar6 + 1;
        lVar4 = lVar4 + 0x120;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

avector<Vec3ff> XMLLoader::loadVec3ffArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<Vec3ff>();

    if (xml->parm("ofs") != "") {
      return loadBinary<avector<Vec3ff>>(xml);
    } 
    else 
    {
      avector<Vec3ff> data;
      if (xml->body.size() % 4 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float4> body");
      data.resize(xml->body.size()/4);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3ff(xml->body[4*i+0].Float(),xml->body[4*i+1].Float(),xml->body[4*i+2].Float(),xml->body[4*i+3].Float());
      return data;
    }
  }